

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::Pipeline::_InternalParse(Pipeline *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  Model *msg;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  Pipeline *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_0029c37c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
    tag_00 = str._4_4_;
    if (str._4_4_ >> 3 == 1) {
      if ((str._4_4_ & 0xff) == 10) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          this_00 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg = _internal_add_models(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (this_00,&msg->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar1) &&
                (bVar1 = google::protobuf::internal::ExpectTag<10u>((char *)ctx_local), bVar1));
        goto LAB_0029c37c;
      }
    }
    else if ((str._4_4_ >> 3 == 2) && ((str._4_4_ & 0xff) == 0x12)) {
      ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
      do {
        ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
        s = _internal_add_names_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (s,(char *)ctx_local,pPStack_20);
        bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return (char *)0x0;
        }
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                          (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
      } while ((bVar1) &&
              (bVar1 = google::protobuf::internal::ExpectTag<18u>((char *)ctx_local), bVar1));
      goto LAB_0029c37c;
    }
    if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Pipeline::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.Model models = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_models(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated string names = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_names();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}